

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<WellFounded>::growTo(vec<WellFounded> *this,uint size)

{
  uint in_ESI;
  uint *in_RDI;
  vec<WellFounded> *unaff_retaddr;
  uint i;
  WellFounded *in_stack_000000d0;
  undefined4 local_10;
  
  if (*in_RDI < in_ESI) {
    reserve(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20));
    for (local_10 = *in_RDI; local_10 < in_ESI; local_10 = local_10 + 1) {
      WellFounded::WellFounded(in_stack_000000d0);
    }
    *in_RDI = in_ESI;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}